

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall XipFile::TocEntry::~TocEntry(TocEntry *this)

{
  ~TocEntry(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TocEntry(uint64_t pos, const uint8_t *pdata)
            : XipEntry(pos)
        {
            _attr= get32le(pdata);
            _filetime= get64le(pdata+0x4);
            _size= get32le(pdata+0xC);
            _rvaname= get32le(pdata+0x10);
            _rvae32= get32le(pdata+0x14);
            _rvao32= get32le(pdata+0x18);
            _rvaload= get32le(pdata+0x1C);
        }